

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O1

base_learner * OjaNewton_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  double dVar3;
  options_i *poVar4;
  int iVar5;
  OjaNewton *__s;
  option_group_definition *poVar6;
  typed_option<int> *ptVar7;
  typed_option<float> *ptVar8;
  float *pfVar9;
  float **ppfVar10;
  ulong uVar11;
  example **ppeVar12;
  learner<OjaNewton,_example> *plVar13;
  uint32_t *puVar14;
  long lVar15;
  free_ptr<OjaNewton> ON;
  bool oja_newton;
  float alpha_inverse;
  string random_init;
  string normalize;
  option_group_definition new_options;
  free_ptr<OjaNewton> local_7e8;
  bool local_7d5;
  float local_7d4;
  options_i *local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  string local_788;
  string local_768;
  undefined1 *local_748 [2];
  undefined1 local_738 [16];
  string local_728;
  undefined1 *local_708 [2];
  undefined1 local_6f8 [16];
  string local_6e8;
  undefined1 *local_6c8 [2];
  undefined1 local_6b8 [16];
  string local_6a8;
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  string local_668;
  undefined1 *local_648 [2];
  undefined1 local_638 [16];
  string local_628;
  undefined1 *local_608;
  long local_600;
  undefined1 local_5f8 [16];
  option_group_definition local_5e8;
  undefined1 *local_5b0 [2];
  undefined1 local_5a0 [16];
  undefined1 *local_590 [2];
  undefined1 local_580 [16];
  string local_570;
  undefined1 *local_550 [2];
  undefined1 local_540 [16];
  undefined1 local_530 [112];
  bool local_4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  undefined1 local_490 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<int> local_170;
  typed_option<int> local_d0;
  
  __s = calloc_or_throw<OjaNewton>(1);
  memset(__s,0,0xb0);
  local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<OjaNewton>;
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>.
  _M_head_impl = __s;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"true","");
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"true","");
  local_608 = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"OjaNewton options","");
  local_5e8.m_name._M_dataplus._M_p = (pointer)&local_5e8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_5e8,local_608,local_608 + local_600);
  local_5e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_608 != local_5f8) {
    operator_delete(local_608);
  }
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"OjaNewton","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_530,&local_628,&local_7d5);
  local_4c0 = true;
  local_648[0] = local_638;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_648,"Online Newton with Oja\'s Sketch","");
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_5e8,(typed_option<bool> *)local_530);
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"sketch_size","");
  VW::config::typed_option<int>::typed_option
            (&local_d0,&local_668,
             &(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m);
  ptVar7 = VW::config::typed_option<int>::default_value(&local_d0,10);
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"size of sketch","");
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar6,ptVar7);
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"epoch_size","");
  VW::config::typed_option<int>::typed_option
            (&local_170,&local_6a8,
             &(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->epoch_size);
  ptVar7 = VW::config::typed_option<int>::default_value(&local_170,1);
  local_6c8[0] = local_6b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"size of epoch","");
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar6,ptVar7);
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"alpha","");
  VW::config::typed_option<float>::typed_option
            (&local_210,&local_6e8,
             &(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->alpha);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_210,1.0);
  local_708[0] = local_6f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_708,"mutiplicative constant for indentiy","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar6,ptVar8)
  ;
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"alpha_inverse","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_350,&local_728,&local_7d4);
  local_748[0] = local_738;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_748,"one over alpha, similar to learning rate","");
  local_7d0 = options;
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar6,(typed_option<float> *)local_350);
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"learning_rate_cnt","");
  VW::config::typed_option<float>::typed_option
            (&local_2b0,&local_768,
             &(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->learning_rate_cnt);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_2b0,2.0);
  local_550[0] = local_540;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_550,"constant for the learning rate 1/t","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar6,ptVar8)
  ;
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"normalize","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_3f0,&local_570,&local_7a8);
  local_590[0] = local_580;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_590,"normalize the features or not","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar6,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_3f0);
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"random_init","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_490,&local_788,&local_7c8);
  local_5b0[0] = local_5a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5b0,"randomize initialization of Oja or not","");
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar6,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_490);
  if (local_5b0[0] != local_5a0) {
    operator_delete(local_5b0[0]);
  }
  local_490._0_8_ = &PTR__typed_option_002d5018;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p);
  }
  if (local_590[0] != local_580) {
    operator_delete(local_590[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002d5018;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  if (local_550[0] != local_540) {
    operator_delete(local_550[0]);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d50c0;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p);
  }
  poVar4 = local_7d0;
  if (local_748[0] != local_738) {
    operator_delete(local_748[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002d50c0;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p);
  }
  if (local_708[0] != local_6f8) {
    operator_delete(local_708[0]);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d50c0;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p);
  }
  if (local_6c8[0] != local_6b8) {
    operator_delete(local_6c8[0]);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d5168;
  if (local_170.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p);
  }
  if (local_688[0] != local_678) {
    operator_delete(local_688[0]);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d5168;
  if (local_d0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p);
  }
  if (local_648[0] != local_638) {
    operator_delete(local_648[0]);
  }
  local_530._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p);
  }
  (**poVar4->_vptr_options_i)(poVar4,&local_5e8);
  pp_Var1 = (_func_int **)(local_530 + 0x10);
  local_530._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"OjaNewton","");
  iVar5 = (*poVar4->_vptr_options_i[1])(poVar4,local_530);
  if ((_func_int **)local_530._0_8_ != pp_Var1) {
    operator_delete((void *)local_530._0_8_);
  }
  if ((char)iVar5 == '\0') {
    plVar13 = (learner<OjaNewton,_example> *)0x0;
  }
  else {
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->all = all;
    iVar5 = std::__cxx11::string::compare((char *)&local_7a8);
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->normalize = iVar5 == 0;
    iVar5 = std::__cxx11::string::compare((char *)&local_7c8);
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->random_init = iVar5 == 0;
    local_530._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"alpha_inverse","");
    iVar5 = (*poVar4->_vptr_options_i[1])(poVar4,local_530);
    if ((_func_int **)local_530._0_8_ != pp_Var1) {
      operator_delete((void *)local_530._0_8_);
    }
    if ((char)iVar5 != '\0') {
      (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->alpha = 1.0 / local_7d4;
    }
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->cnt = 0;
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->t = 1;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->ev = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->b = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->D = pfVar9;
    ppfVar10 = calloc_or_throw<float*>
                         ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                                 _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->A = ppfVar10;
    ppfVar10 = calloc_or_throw<float*>
                         ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                                 _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->K = ppfVar10;
    uVar11 = (ulong)(uint)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m;
    if (0 < (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m) {
      lVar15 = 0;
      do {
        pfVar9 = calloc_or_throw<float>((long)((int)uVar11 + 1));
        (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->A[lVar15 + 1] = pfVar9;
        pfVar9 = calloc_or_throw<float>
                           ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>
                                   ._M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                   super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
        (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->K[lVar15 + 1] = pfVar9;
        (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->A[lVar15 + 1][lVar15 + 1] = 1.0;
        (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->K[lVar15 + 1][lVar15 + 1] = 1.0;
        (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->D[lVar15 + 1] = 1.0;
        uVar11 = (ulong)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m;
        lVar15 = lVar15 + 1;
      } while (lVar15 < (long)uVar11);
    }
    ppeVar12 = calloc_or_throw<example*>
                         ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                                 _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->epoch_size
                         );
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->buffer = ppeVar12;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->epoch_size);
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->weight_buffer = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->zv = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->vv = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->tmp = pfVar9;
    ((local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->data).ON =
         local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    ((local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->data).Zx = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    ((local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->data).AZx = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    ((local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->data).delta = pfVar9;
    dVar3 = log2((double)((local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 2));
    dVar3 = ceil(dVar3);
    if ((all->weights).sparse == true) {
      sparse_parameters::stride_shift(&(all->weights).sparse_weights,(uint32_t)(long)dVar3);
    }
    else {
      (all->weights).dense_weights._stride_shift = (uint32_t)(long)dVar3;
    }
    puVar14 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar14 = &(all->weights).sparse_weights._stride_shift;
    }
    plVar13 = LEARNER::init_learner<OjaNewton,example,LEARNER::learner<char,char>>
                        (&local_7e8,learn,predict,(ulong)(uint)(1 << ((byte)*puVar14 & 0x1f)));
    *(code **)(plVar13 + 0x80) = save_load;
    uVar2 = *(undefined8 *)(plVar13 + 0x18);
    *(undefined8 *)(plVar13 + 0x70) = uVar2;
    *(undefined8 *)(plVar13 + 0x78) = *(undefined8 *)(plVar13 + 0x20);
    *(undefined8 *)(plVar13 + 0x58) = uVar2;
    *(code **)(plVar13 + 0x68) = keep_example;
    *(undefined8 *)(plVar13 + 0xb8) = uVar2;
    *(undefined8 *)(plVar13 + 0xc0) = *(undefined8 *)(plVar13 + 0x20);
    *(code **)(plVar13 + 200) = finish;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_5e8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8.m_name._M_dataplus._M_p != &local_5e8.m_name.field_2) {
    operator_delete(local_5e8.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p);
  }
  if (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl != (OjaNewton *)0x0) {
    (*(code *)local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_7e8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar13;
}

Assistant:

base_learner* OjaNewton_setup(options_i& options, vw& all)
{
  auto ON = scoped_calloc_or_throw<OjaNewton>();

  bool oja_newton;
  float alpha_inverse;

  // These two are the only two boolean options that default to true. For now going to do this hack
  // as the infrastructure doesn't easily support this possibility at the same time providing the
  // ease of bool switches elsewhere. It seems that the switch behavior is more critical because
  // of the positional data argument.
  std::string normalize = "true";
  std::string random_init = "true";
  option_group_definition new_options("OjaNewton options");
  new_options.add(make_option("OjaNewton", oja_newton).keep().help("Online Newton with Oja's Sketch"))
      .add(make_option("sketch_size", ON->m).default_value(10).help("size of sketch"))
      .add(make_option("epoch_size", ON->epoch_size).default_value(1).help("size of epoch"))
      .add(make_option("alpha", ON->alpha).default_value(1.f).help("mutiplicative constant for indentiy"))
      .add(make_option("alpha_inverse", alpha_inverse).help("one over alpha, similar to learning rate"))
      .add(make_option("learning_rate_cnt", ON->learning_rate_cnt)
               .default_value(2.f)
               .help("constant for the learning rate 1/t"))
      .add(make_option("normalize", normalize).help("normalize the features or not"))
      .add(make_option("random_init", random_init).help("randomize initialization of Oja or not"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("OjaNewton"))
    return nullptr;

  ON->all = &all;

  ON->normalize = normalize == "true";
  ON->random_init = random_init == "true";

  if (options.was_supplied("alpha_inverse"))
    ON->alpha = 1.f / alpha_inverse;

  ON->cnt = 0;
  ON->t = 1;
  ON->ev = calloc_or_throw<float>(ON->m + 1);
  ON->b = calloc_or_throw<float>(ON->m + 1);
  ON->D = calloc_or_throw<float>(ON->m + 1);
  ON->A = calloc_or_throw<float*>(ON->m + 1);
  ON->K = calloc_or_throw<float*>(ON->m + 1);
  for (int i = 1; i <= ON->m; i++)
  {
    ON->A[i] = calloc_or_throw<float>(ON->m + 1);
    ON->K[i] = calloc_or_throw<float>(ON->m + 1);
    ON->A[i][i] = 1;
    ON->K[i][i] = 1;
    ON->D[i] = 1;
  }

  ON->buffer = calloc_or_throw<example*>(ON->epoch_size);
  ON->weight_buffer = calloc_or_throw<float>(ON->epoch_size);

  ON->zv = calloc_or_throw<float>(ON->m + 1);
  ON->vv = calloc_or_throw<float>(ON->m + 1);
  ON->tmp = calloc_or_throw<float>(ON->m + 1);

  ON->data.ON = ON.get();
  ON->data.Zx = calloc_or_throw<float>(ON->m + 1);
  ON->data.AZx = calloc_or_throw<float>(ON->m + 1);
  ON->data.delta = calloc_or_throw<float>(ON->m + 1);

  all.weights.stride_shift((uint32_t)ceil(log2(ON->m + 2)));

  learner<OjaNewton, example>& l = init_learner(ON, learn, predict, all.weights.stride());
  l.set_save_load(save_load);
  l.set_finish_example(keep_example);
  l.set_finish(finish);
  return make_base(l);
}